

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_script.cpp
# Opt level: O0

Script * cfd::core::ContractHashUtil::GetContractScript
                   (Script *__return_storage_ptr__,Script *claim_script,Script *fedpeg_script)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ScriptOperator *this;
  size_t sVar4;
  ByteData *in_stack_fffffffffffffe78;
  ByteData256 *in_stack_fffffffffffffe90;
  ByteData local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  ByteData256 local_108;
  undefined1 local_f0 [8];
  ByteData data;
  ScriptElement *element;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range2;
  ByteData256 tweak;
  ByteData pubkey_data;
  bool liquidv1_op_else;
  undefined1 local_60 [8];
  ByteData claim_script_data;
  ScriptBuilder builder;
  bool is_liquidv1_watchman;
  Script *fedpeg_script_local;
  Script *claim_script_local;
  
  bVar2 = CheckLiquidV1Watchman(fedpeg_script);
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x70bcad);
  Script::GetData((ByteData *)local_60,claim_script);
  bVar1 = false;
  ByteData::ByteData((ByteData *)
                     &tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData256::ByteData256((ByteData256 *)&__range2);
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &__begin2,fedpeg_script);
  __end2 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                     ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *
                      )&__begin2);
  element = (ScriptElement *)
            ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                      ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        *)&__begin2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                                     *)&element), bVar3) {
    data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&__end2);
    if (bVar2) {
      this = ScriptElement::GetOpCode
                       ((ScriptElement *)
                        data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = ScriptOperator::operator==(this,(ScriptOperator *)ScriptOperator::OP_ELSE);
      if (bVar3) {
        bVar1 = true;
      }
    }
    ScriptElement::GetBinaryData
              ((ByteData *)local_f0,
               (ScriptElement *)
               data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    if (((bVar1) ||
        (bVar3 = ScriptElement::IsBinary
                           ((ScriptElement *)
                            data.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar3)) ||
       (sVar4 = ByteData::GetDataSize((ByteData *)local_f0), sVar4 != 0x21)) {
      ScriptBuilder::AppendElement
                ((ScriptBuilder *)
                 &claim_script_data.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ScriptElement *)
                 data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      ByteData::GetBytes(&local_120,(ByteData *)local_f0);
      CryptoUtil::HmacSha256(&local_108,&local_120,(ByteData *)local_60);
      in_stack_fffffffffffffe90 = &local_108;
      ByteData256::operator=((ByteData256 *)&__range2,in_stack_fffffffffffffe90);
      ByteData256::~ByteData256((ByteData256 *)0x70beba);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                (&in_stack_fffffffffffffe90->data_);
      WallyUtil::AddTweakPubkey(&local_138,(ByteData *)local_f0,(ByteData256 *)&__range2,true);
      ByteData::operator=(&local_138,in_stack_fffffffffffffe78);
      ByteData::~ByteData((ByteData *)0x70bf11);
      ScriptBuilder::AppendData
                ((ScriptBuilder *)
                 &claim_script_data.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ByteData *)
                 &tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ByteData::~ByteData((ByteData *)0x70bf6d);
    __gnu_cxx::
    __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
    ::operator++(&__end2);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             in_stack_fffffffffffffe90);
  ScriptBuilder::Build
            (__return_storage_ptr__,
             (ScriptBuilder *)
             &claim_script_data.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData256::~ByteData256((ByteData256 *)0x70bfb6);
  ByteData::~ByteData((ByteData *)0x70bfbf);
  ByteData::~ByteData((ByteData *)0x70bfc8);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x70bfd1);
  return __return_storage_ptr__;
}

Assistant:

Script ContractHashUtil::GetContractScript(
    const Script& claim_script, const Script& fedpeg_script) {
  bool is_liquidv1_watchman = CheckLiquidV1Watchman(fedpeg_script);

  ScriptBuilder builder;
  ByteData claim_script_data = claim_script.GetData();
  bool liquidv1_op_else = false;
  ByteData pubkey_data;
  ByteData256 tweak;
  for (const ScriptElement& element : fedpeg_script.GetElementList()) {
    if (is_liquidv1_watchman &&
        (element.GetOpCode() == ScriptOperator::OP_ELSE)) {
      liquidv1_op_else = true;
    }
    ByteData data = element.GetBinaryData();
    if ((!liquidv1_op_else) && element.IsBinary() &&
        (data.GetDataSize() == Pubkey::kCompressedPubkeySize)) {
      tweak = CryptoUtil::HmacSha256(data.GetBytes(), claim_script_data);
      pubkey_data = WallyUtil::AddTweakPubkey(data, tweak, true);
      builder.AppendData(pubkey_data);
    } else {
      builder.AppendElement(element);
    }
  }

  return builder.Build();
}